

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_tc.c
# Opt level: O0

olsrv2_tc_attachment * olsrv2_tc_endpoint_add(olsrv2_tc_node *node,os_route_key *prefix,_Bool mesh)

{
  uint8_t *puVar1;
  long lVar2;
  undefined4 uVar3;
  void *local_70;
  olsrv2_tc_node *local_68;
  int local_5c;
  void *pvStack_58;
  int i;
  olsrv2_tc_endpoint *end;
  olsrv2_tc_attachment *net;
  _Bool mesh_local;
  os_route_key *prefix_local;
  olsrv2_tc_node *node_local;
  
  lVar2 = avl_find(&node->_attached_networks,prefix);
  if (lVar2 == 0) {
    local_68 = (olsrv2_tc_node *)0x0;
  }
  else {
    local_68 = (olsrv2_tc_node *)(lVar2 + -0x28);
  }
  if (local_68 == (olsrv2_tc_node *)0x0) {
    node_local = (olsrv2_tc_node *)oonf_class_malloc(&_tc_attached_class);
    if (node_local == (olsrv2_tc_node *)0x0) {
      node_local = (olsrv2_tc_node *)0x0;
    }
    else {
      lVar2 = avl_find(&_tc_endpoint_tree,prefix);
      if (lVar2 == 0) {
        local_70 = (void *)0x0;
      }
      else {
        local_70 = (void *)(lVar2 + -0xb0);
      }
      pvStack_58 = local_70;
      if (local_70 == (void *)0x0) {
        pvStack_58 = (void *)oonf_class_malloc(&_tc_endpoint_class);
        if (pvStack_58 == (void *)0x0) {
          oonf_class_free(&_tc_attached_class,node_local);
          return (olsrv2_tc_attachment *)0x0;
        }
        uVar3 = 2;
        if (mesh) {
          uVar3 = 1;
        }
        *(undefined4 *)((long)pvStack_58 + 0x24) = uVar3;
        avl_init((long)pvStack_58 + 0x88,&os_routing_avl_cmp_route_key,0);
        memcpy(pvStack_58,prefix,0x24);
        *(void **)((long)pvStack_58 + 0xd8) = pvStack_58;
        avl_insert(&_tc_endpoint_tree,(long)pvStack_58 + 0xb0);
        oonf_class_event(&_tc_endpoint_class,pvStack_58,1);
      }
      *(olsrv2_tc_node **)(node_local->target).prefix.dst._addr = node;
      *(void **)((node_local->target).prefix.dst._addr + 8) = pvStack_58;
      for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
        puVar1 = (node_local->target).prefix.src._addr + (long)local_5c * 4 + -2;
        puVar1[0] = 0xff;
        puVar1[1] = 0xff;
        puVar1[2] = 0xff;
        puVar1[3] = '\0';
      }
      (node_local->target)._dijkstra._node.key = pvStack_58;
      avl_insert(&node->_attached_networks,&(node_local->target)._dijkstra);
      *(olsrv2_tc_node **)&node_local->ansn = node;
      avl_insert((long)pvStack_58 + 0x88,&(node_local->target)._dijkstra.path_cost);
      olsrv2_routing_dijkstra_node_init
                ((olsrv2_dijkstra_node *)((long)pvStack_58 + 0x28),(netaddr *)node);
      oonf_class_event(&_tc_attached_class,node_local,1);
    }
  }
  else {
    node_local = local_68;
  }
  return (olsrv2_tc_attachment *)node_local;
}

Assistant:

struct olsrv2_tc_attachment *
olsrv2_tc_endpoint_add(struct olsrv2_tc_node *node, struct os_route_key *prefix, bool mesh) {
  struct olsrv2_tc_attachment *net;
  struct olsrv2_tc_endpoint *end;
  int i;

  net = avl_find_element(&node->_attached_networks, prefix, net, _src_node);
  if (net != NULL) {
    return net;
  }

  net = oonf_class_malloc(&_tc_attached_class);
  if (net == NULL) {
    return NULL;
  }

  end = avl_find_element(&_tc_endpoint_tree, prefix, end, _node);
  if (end == NULL) {
    /* create new endpoint */
    end = oonf_class_malloc(&_tc_endpoint_class);
    if (end == NULL) {
      oonf_class_free(&_tc_attached_class, net);
      return NULL;
    }

    /* initialize endpoint */
    end->target.type = mesh ? OLSRV2_ADDRESS_TARGET : OLSRV2_NETWORK_TARGET;
    avl_init(&end->_attached_networks, os_routing_avl_cmp_route_key, false);

    /* attach to global tree */
    memcpy(&end->target.prefix, prefix, sizeof(*prefix));
    end->_node.key = &end->target.prefix;
    avl_insert(&_tc_endpoint_tree, &end->_node);

    oonf_class_event(&_tc_endpoint_class, end, OONF_OBJECT_ADDED);
  }

  /* initialize attached network */
  net->src = node;
  net->dst = end;
  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    net->cost[i] = RFC7181_METRIC_INFINITE;
  }

  /* hook into src node */
  net->_src_node.key = &end->target.prefix;
  avl_insert(&node->_attached_networks, &net->_src_node);

  /* hook into endpoint */
  net->_endpoint_node.key = &node->target.prefix;
  avl_insert(&end->_attached_networks, &net->_endpoint_node);

  /* initialize dijkstra data */
  olsrv2_routing_dijkstra_node_init(&end->target._dijkstra, &node->target.prefix.dst);

  oonf_class_event(&_tc_attached_class, net, OONF_OBJECT_ADDED);
  return net;
}